

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::Reserve(RepeatedField<double> *this,int new_size)

{
  undefined1 auVar1 [16];
  int *piVar2;
  ulong uVar3;
  double *pdVar4;
  int local_24;
  double *local_20;
  double *old_elements;
  RepeatedField<double> *pRStack_10;
  int new_size_local;
  RepeatedField<double> *this_local;
  
  if (this->total_size_ < new_size) {
    local_20 = this->elements_;
    local_24 = this->total_size_ << 1;
    old_elements._4_4_ = new_size;
    pRStack_10 = this;
    piVar2 = std::max<int>(&local_24,(int *)((long)&old_elements + 4));
    piVar2 = std::max<int>(&internal::kMinRepeatedFieldAllocationSize,piVar2);
    this->total_size_ = *piVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->total_size_;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    this->elements_ = pdVar4;
    if ((local_20 != (double *)0x0) &&
       (MoveArray(this,this->elements_,local_20,this->current_size_), local_20 != (double *)0x0)) {
      operator_delete__(local_20);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;

  Element* old_elements = elements_;
  total_size_ = max(google::protobuf::internal::kMinRepeatedFieldAllocationSize,
                    max(total_size_ * 2, new_size));
  elements_ = new Element[total_size_];
  if (old_elements != NULL) {
    MoveArray(elements_, old_elements, current_size_);
    delete [] old_elements;
  }
}